

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64AddressingModes.h
# Opt level: O0

uint64_t AArch64_AM_decodeLogicalImmediate(uint64_t val,uint regSize)

{
  uint uVar1;
  uint uVar2;
  undefined8 local_40;
  uint64_t pattern;
  uint S;
  uint R;
  uint size;
  int len;
  uint i;
  uint imms;
  uint immr;
  uint N;
  uint regSize_local;
  uint64_t val_local;
  
  uVar1 = (uint)val & 0x3f;
  uVar2 = countLeadingZeros(((uint)(val >> 0xc) & 1) << 6 | (uVar1 ^ 0xffffffff) & 0x3f);
  S = 1 << (0x1fU - (char)uVar2 & 0x1f);
  local_40 = (1L << (((byte)uVar1 & (char)S - 1U) + 1 & 0x3f)) - 1;
  for (size = 0; size < ((uint)(val >> 6) & 0x3f & S - 1); size = size + 1) {
    local_40 = ror(local_40,S);
  }
  for (; S != regSize; S = S << 1) {
    local_40 = local_40 << ((byte)S & 0x3f) | local_40;
  }
  return local_40;
}

Assistant:

static inline uint64_t AArch64_AM_decodeLogicalImmediate(uint64_t val, unsigned regSize)
{
	// Extract the N, imms, and immr fields.
	unsigned N = (val >> 12) & 1;
	unsigned immr = (val >> 6) & 0x3f;
	unsigned imms = val & 0x3f;
	unsigned i;

	// assert((regSize == 64 || N == 0) && "undefined logical immediate encoding");
	int len = 31 - countLeadingZeros((N << 6) | (~imms & 0x3f));
	// assert(len >= 0 && "undefined logical immediate encoding");
	unsigned size = (1 << len);
	unsigned R = immr & (size - 1);
	unsigned S = imms & (size - 1);
	// assert(S != size - 1 && "undefined logical immediate encoding");
	uint64_t pattern = (1ULL << (S + 1)) - 1;
	for (i = 0; i < R; ++i)
		pattern = ror(pattern, size);

	// Replicate the pattern to fill the regSize.
	while (size != regSize) {
		pattern |= (pattern << size);
		size *= 2;
	}

	return pattern;
}